

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindowlayout_p.cpp
# Opt level: O0

void * __thiscall QMainWindowLayout::qt_metacast(QMainWindowLayout *this,char *_clname)

{
  int iVar1;
  QLayout *in_RSI;
  char *in_RDI;
  char *local_8;
  
  if (in_RSI == (QLayout *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = strcmp((char *)in_RSI,
                   qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN17QMainWindowLayoutE_t>
                   .strings);
    local_8 = in_RDI;
    if (iVar1 != 0) {
      iVar1 = strcmp((char *)in_RSI,"QMainWindowLayoutSeparatorHelper<QMainWindowLayout>");
      if (iVar1 == 0) {
        local_8 = in_RDI + 0x20;
      }
      else {
        local_8 = (char *)QLayout::qt_metacast(in_RSI,in_RDI);
      }
    }
  }
  return local_8;
}

Assistant:

void *QMainWindowLayout::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN17QMainWindowLayoutE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QMainWindowLayoutSeparatorHelper<QMainWindowLayout>"))
        return static_cast< QMainWindowLayoutSeparatorHelper<QMainWindowLayout>*>(this);
    return QLayout::qt_metacast(_clname);
}